

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::expandToDepth(QTreeView *this,int depth)

{
  QSet<QPersistentModelIndex> *other;
  QTreeViewPrivate *this_00;
  Span *pSVar1;
  Entry *pEVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  pointer pQVar6;
  long lVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  QSet<QPersistentModelIndex> expandedIndexs;
  QModelIndex local_70;
  piter local_58;
  QSet<QPersistentModelIndex> collapsedIndexes;
  QHash<QPersistentModelIndex,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QList<QTreeViewItem>::clear(&this_00->viewItems);
  local_40.d = (Data *)0x0;
  other = &this_00->expandedIndexes;
  QHash<QPersistentModelIndex,_QHashDummyValue>::operator=(&local_40,&other->q_hash);
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear(&other->q_hash);
  QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
  lVar7 = 0;
  QTreeViewPrivate::layout(this_00,-1,false,false);
  for (uVar8 = 0; uVar8 < (ulong)(this_00->viewItems).d.size; uVar8 = uVar8 + 1) {
    if ((-1 < depth) &&
       ((uint)*(ushort *)(&((this_00->viewItems).d.ptr)->field_0x20 + lVar7) <= (uint)depth)) {
      pQVar6 = QList<QTreeViewItem>::data(&this_00->viewItems);
      (&pQVar6->field_0x1c)[lVar7] = (&pQVar6->field_0x1c)[lVar7] | 1;
      QTreeViewPrivate::layout(this_00,(int)uVar8,false,false);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_70,
                 (QModelIndex *)((long)&(((this_00->viewItems).d.ptr)->index).r + lVar7));
      QTreeViewPrivate::storeExpanded(this_00,(QPersistentModelIndex *)&local_70);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_70);
    }
    lVar7 = lVar7 + 0x28;
  }
  local_70._0_16_ =
       QMetaMethod::fromSignal<void(QTreeView::*)(QModelIndex_const&)>((QMetaMethod *)collapsed,0);
  bVar3 = QObject::isSignalConnected((QMetaMethod *)this);
  local_70._0_16_ =
       QMetaMethod::fromSignal<void(QTreeView::*)(QModelIndex_const&)>((QMetaMethod *)expanded,0);
  bVar4 = QObject::isSignalConnected((QMetaMethod *)this);
  if (((bVar4 | bVar3) == 1) &&
     ((*(uint *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x30) & 2) == 0)) {
    collapsedIndexes.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
    operator-((QSet<QPersistentModelIndex> *)&collapsedIndexes.q_hash,
              (QSet<QPersistentModelIndex> *)&local_40);
    local_58 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::constBegin
                                (&collapsedIndexes.q_hash);
    while( true ) {
      if (local_58.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 &&
          local_58.bucket == 0) break;
      pSVar1 = (local_58.d)->spans;
      uVar8 = local_58.bucket >> 7;
      bVar3 = pSVar1[uVar8].offsets[(uint)local_58.bucket & 0x7f];
      pEVar2 = pSVar1[uVar8].entries;
      cVar5 = QPersistentModelIndex::isValid();
      if (cVar5 != '\0') {
        cVar5 = QPersistentModelIndex::flags();
        if (-1 < cVar5) {
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_70,(QPersistentModelIndex *)(pEVar2 + bVar3));
          collapsed(this,&local_70);
        }
      }
      QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
      operator++(&local_58);
    }
    expandedIndexs.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
    operator-((QSet<QPersistentModelIndex> *)&expandedIndexs.q_hash,other);
    local_58 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::constBegin
                                (&expandedIndexs.q_hash);
    while( true ) {
      if (local_58.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 &&
          local_58.bucket == 0) break;
      pSVar1 = (local_58.d)->spans;
      uVar8 = local_58.bucket >> 7;
      bVar3 = pSVar1[uVar8].offsets[(uint)local_58.bucket & 0x7f];
      pEVar2 = pSVar1[uVar8].entries;
      cVar5 = QPersistentModelIndex::isValid();
      if (cVar5 != '\0') {
        cVar5 = QPersistentModelIndex::flags();
        if (-1 < cVar5) {
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_70,(QPersistentModelIndex *)(pEVar2 + bVar3));
          expanded(this,&local_70);
        }
      }
      QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
      operator++(&local_58);
    }
    QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&expandedIndexs.q_hash);
    QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&collapsedIndexes.q_hash);
  }
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this);
  QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  QTreeViewPrivate::updateAccessibility(this_00);
  QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::expandToDepth(int depth)
{
    Q_D(QTreeView);
    d->viewItems.clear();
    QSet<QPersistentModelIndex> old_expandedIndexes;
    old_expandedIndexes = d->expandedIndexes;
    d->expandedIndexes.clear();
    d->interruptDelayedItemsLayout();
    d->layout(-1);
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if (q20::cmp_less_equal(d->viewItems.at(i).level, depth)) {
            d->viewItems[i].expanded = true;
            d->layout(i);
            d->storeExpanded(d->viewItems.at(i).index);
        }
    }

    bool someSignalEnabled = isSignalConnected(QMetaMethod::fromSignal(&QTreeView::collapsed));
    someSignalEnabled |= isSignalConnected(QMetaMethod::fromSignal(&QTreeView::expanded));

    if (!signalsBlocked() && someSignalEnabled) {
        // emit signals
        QSet<QPersistentModelIndex> collapsedIndexes = old_expandedIndexes - d->expandedIndexes;
        QSet<QPersistentModelIndex>::const_iterator i = collapsedIndexes.constBegin();
        for (; i != collapsedIndexes.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit collapsed(mi);
        }

        QSet<QPersistentModelIndex> expandedIndexs = d->expandedIndexes - old_expandedIndexes;
        i = expandedIndexs.constBegin();
        for (; i != expandedIndexs.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit expanded(mi);
        }
    }

    updateGeometries();
    d->viewport->update();
    d->updateAccessibility();
}